

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::ListFields
          (Reflection *this,Message *message,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  long *plVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  FieldDescriptor *this_00;
  OneofDescriptor *pOVar6;
  OneofDescriptor *pOVar7;
  char *failure_msg;
  int iVar8;
  int i;
  long lVar9;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar10;
  pointer ppFVar11;
  pointer ppFVar12;
  uint32_t last;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *output_local;
  uint32_t *local_68;
  ReflectionSchema *local_60;
  uint32_t *local_58;
  LogMessageFatal local_50;
  anon_class_16_2_4c782404 append_to_output;
  
  ppFVar11 = (output->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((output->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar11) {
    (output->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppFVar11;
  }
  if ((this->schema_).default_instance_ != message) {
    output_local = output;
    if ((this->schema_).has_bits_offset_ == -1) {
      local_68 = (uint32_t *)0x0;
    }
    else {
      local_68 = GetHasBits(this,message);
    }
    local_60 = &this->schema_;
    local_58 = (this->schema_).has_bit_indices_;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve(output,(long)this->descriptor_->field_count_);
    iVar8 = this->last_non_weak_field_index_;
    append_to_output.last = &last;
    last = 0;
    append_to_output.output = &output_local;
    for (lVar9 = 0; lVar9 <= iVar8; lVar9 = lVar9 + 1) {
      this_00 = Descriptor::field(this->descriptor_,(int)lVar9);
      bVar3 = FieldDescriptor::is_repeated(this_00);
      if (bVar3) {
        iVar4 = FieldSize(this,message,this_00);
        if (0 < iVar4) goto LAB_0034d8fb;
      }
      else {
        pOVar6 = FieldDescriptor::containing_oneof(this_00);
        pOVar7 = FieldDescriptor::real_containing_oneof(this_00);
        if (pOVar7 == (OneofDescriptor *)0x0) {
          if ((local_68 == (uint32_t *)0x0) || (local_58[lVar9] == 0xffffffff)) {
            bVar3 = HasFieldSingular(this,message,this_00);
          }
          else {
            bVar3 = IsFieldPresentGivenHasbits(this,message,this_00,local_68,local_58[lVar9]);
          }
          if (bVar3 != false) goto LAB_0034d8fb;
        }
        else if ((ulong)*(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                                 (long)(int)(((long)pOVar6 -
                                             (long)pOVar6->containing_type_->oneof_decls_) / 0x38) *
                                 4 + (ulong)(uint)(this->schema_).oneof_case_offset_) ==
                 (long)this_00->number_) {
LAB_0034d8fb:
          ListFields::anon_class_16_2_4c782404::operator()(&append_to_output,this_00);
        }
      }
    }
    if (last == 0xffffffff) {
      std::
      sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::(anonymous_namespace)::FieldNumberSorter>
                ((output_local->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (output_local->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      ppFVar11 = (output_local->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      last = ppFVar11[-1]->number_;
    }
    else {
      ppFVar11 = (output_local->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
    }
    ppFVar12 = (output_local->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    pvVar10 = output_local;
    if ((this->schema_).extensions_offset_ != -1) {
      lVar9 = (long)ppFVar11 - (long)ppFVar12;
      uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(local_60);
      internal::ExtensionSet::AppendToList
                ((ExtensionSet *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                 this->descriptor_,this->descriptor_pool_,output_local);
      pvVar10 = output_local;
      ppFVar12 = (output_local->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppFVar11 = (output_local->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      plVar1 = (long *)((long)ppFVar12 + lVar9);
      bVar3 = std::
              is_sorted<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::(anonymous_namespace)::FieldNumberSorter>
                        (plVar1,ppFVar11);
      if (!bVar3) {
        failure_msg = 
        "std::is_sorted(output->begin() + last_size, output->end(), FieldNumberSorter())";
        iVar8 = 0x717;
        goto LAB_0034daa1;
      }
      if ((long)ppFVar11 - (long)ppFVar12 != lVar9) {
        uVar2 = *(uint *)(*plVar1 + 4);
        bVar3 = last <= uVar2;
        last = 0xffffffff;
        if (bVar3) {
          last = uVar2;
        }
      }
    }
    if (last == 0xffffffff) {
      std::
      sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::(anonymous_namespace)::FieldNumberSorter>
                (ppFVar12,(pvVar10->
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish);
    }
    else {
      bVar3 = std::
              is_sorted<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::(anonymous_namespace)::FieldNumberSorter>
                        ();
      if (!bVar3) {
        failure_msg = "std::is_sorted(output->begin(), output->end(), FieldNumberSorter())";
        iVar8 = 0x71e;
LAB_0034daa1:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,iVar8,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_50);
      }
    }
  }
  return;
}

Assistant:

void Reflection::ListFields(const Message& message,
                            std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticeable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32_t* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : nullptr;
  const uint32_t* const has_bits_indices = schema_.has_bit_indices_;
  output->reserve(descriptor_->field_count());
  const int last_non_weak_field_index = last_non_weak_field_index_;
  // Fields in messages are usually added with the increasing tags.
  uint32_t last = 0;  // UINT32_MAX if out-of-order
  auto append_to_output = [&last, &output](const FieldDescriptor* field) {
    CheckInOrder(field, &last);
    output->push_back(field);
  };
  for (int i = 0; i <= last_non_weak_field_index; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        append_to_output(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (schema_.InRealOneof(field)) {
        const uint32_t* const oneof_case_array =
            GetConstPointerAtOffset<uint32_t>(&message,
                                              schema_.oneof_case_offset_);
        // Equivalent to: HasOneofField(message, field)
        if (static_cast<int64_t>(oneof_case_array[containing_oneof->index()]) ==
            field->number()) {
          append_to_output(field);
        }
      } else if (has_bits && has_bits_indices[i] != static_cast<uint32_t>(-1)) {
        // Equivalent to: HasFieldSingular(message, field)
        if (IsFieldPresentGivenHasbits(message, field, has_bits,
                                       has_bits_indices[i])) {
          append_to_output(field);
        }
      } else if (HasFieldSingular(message, field)) {
        // Fall back on proto3-style HasBit.
        append_to_output(field);
      }
    }
  }
  // Descriptors of ExtensionSet are appended in their increasing tag
  // order and they are usually bigger than the field tags so if all fields are
  // not sorted, let them be sorted.
  if (last == UINT32_MAX) {
    std::sort(output->begin(), output->end(), FieldNumberSorter());
    last = output->back()->number();
  }
  size_t last_size = output->size();
  if (schema_.HasExtensionSet()) {
    // Descriptors of ExtensionSet are appended in their increasing order.
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
    ABSL_DCHECK(std::is_sorted(output->begin() + last_size, output->end(),
                               FieldNumberSorter()));
    if (output->size() != last_size) {
      CheckInOrder((*output)[last_size], &last);
    }
  }
  if (last != UINT32_MAX) {
    ABSL_DCHECK(
        std::is_sorted(output->begin(), output->end(), FieldNumberSorter()));
  } else {
    // ListFields() must sort output by field number.
    std::sort(output->begin(), output->end(), FieldNumberSorter());
  }
}